

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
libcellml::Annotator::AnnotatorImpl::setId(AnnotatorImpl *this,AnyCellmlElementPtr *item,string *id)

{
  CellmlElementType CVar1;
  char *index;
  AnyCellmlElement __s;
  UnitsPtr UVar2;
  UnitsItemPtr unitsItem;
  AnyCellmlElement local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  VariablePtr local_30;
  VariablePtr local_20;
  
  CVar1 = AnyCellmlElement::type
                    ((item->
                     super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  switch(CVar1) {
  case COMPONENT:
    AnyCellmlElement::component(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
    break;
  case COMPONENT_REF:
    AnyCellmlElement::component(&local_40);
    ComponentEntity::setEncapsulationId((ComponentEntity *)local_40.mPimpl,id);
    break;
  case CONNECTION:
    AnyCellmlElement::variablePair(&local_40);
    VariablePair::variable1((VariablePair *)&local_30);
    VariablePair::variable2((VariablePair *)&local_20);
    Variable::setEquivalenceConnectionId(&local_30,&local_20,id);
    goto LAB_001c1b7f;
  case ENCAPSULATION:
    AnyCellmlElement::model(&local_40);
    ComponentEntity::setEncapsulationId((ComponentEntity *)local_40.mPimpl,id);
    break;
  case IMPORT:
    AnyCellmlElement::importSource(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
    break;
  case MAP_VARIABLES:
    AnyCellmlElement::variablePair(&local_40);
    VariablePair::variable1((VariablePair *)&local_30);
    VariablePair::variable2((VariablePair *)&local_20);
    Variable::setEquivalenceMappingId(&local_30,&local_20,id);
LAB_001c1b7f:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
LAB_001c1b89:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  default:
    AnyCellmlElement::variable(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
    break;
  case MODEL:
    AnyCellmlElement::model(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
    break;
  case RESET:
    AnyCellmlElement::reset(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
    break;
  case RESET_VALUE:
    AnyCellmlElement::reset(&local_40);
    Reset::setResetValueId((Reset *)local_40.mPimpl,id);
    break;
  case TEST_VALUE:
    AnyCellmlElement::reset(&local_40);
    Reset::setTestValueId((Reset *)local_40.mPimpl,id);
    break;
  case UNIT:
    AnyCellmlElement::unitsItem(&local_40);
    __s.mPimpl = local_40.mPimpl;
    UVar2 = UnitsItem::units((UnitsItem *)&local_30);
    index = UnitsItem::index((UnitsItem *)local_40.mPimpl,(char *)__s.mPimpl,
                             (int)UVar2.
                                  super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
    Units::setUnitId((Units *)local_30.
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(size_t)index,id);
    goto LAB_001c1b89;
  case UNITS:
    AnyCellmlElement::units(&local_40);
    Entity::setId((Entity *)local_40.mPimpl,id);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void Annotator::AnnotatorImpl::setId(const AnyCellmlElementPtr &item, const std::string &id)
{
    switch (item->type()) {
    case CellmlElementType::COMPONENT:
        item->component()->setId(id);
        break;
    case CellmlElementType::COMPONENT_REF:
        item->component()->setEncapsulationId(id);
        break;
    case CellmlElementType::CONNECTION: {
        auto variablePair = item->variablePair();
        Variable::setEquivalenceConnectionId(variablePair->variable1(), variablePair->variable2(), id);
    } break;
    case CellmlElementType::ENCAPSULATION:
        item->model()->setEncapsulationId(id);
        break;
    case CellmlElementType::IMPORT:
        item->importSource()->setId(id);
        break;
    case CellmlElementType::MAP_VARIABLES: {
        auto variablePair = item->variablePair();
        Variable::setEquivalenceMappingId(variablePair->variable1(), variablePair->variable2(), id);
    } break;
    case CellmlElementType::MODEL:
        item->model()->setId(id);
        break;
    case CellmlElementType::RESET:
        item->reset()->setId(id);
        break;
    case CellmlElementType::RESET_VALUE:
        item->reset()->setResetValueId(id);
        break;
    case CellmlElementType::TEST_VALUE:
        item->reset()->setTestValueId(id);
        break;
    case CellmlElementType::UNIT: {
        auto unitsItem = item->unitsItem();
        unitsItem->units()->setUnitId(unitsItem->index(), id);
    } break;
    case CellmlElementType::UNITS:
        item->units()->setId(id);
        break;
    default: /* CellmlElementType::VARIABLE */
        item->variable()->setId(id);
        break;
    }
}